

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.cpp
# Opt level: O1

bool __thiscall asl::WebSocket::closed(WebSocket *this)

{
  int iVar1;
  bool bVar2;
  
  bVar2 = true;
  if (this->_closed == false) {
    iVar1 = (*((this->_socket).super_SmartObject._p)->_vptr_SmartObject_[5])();
    if ((char)iVar1 == '\0') {
      bVar2 = false;
    }
    else {
      this->_closed = true;
      (*((this->_socket).super_SmartObject._p)->_vptr_SmartObject_[0xb])();
    }
  }
  return bVar2;
}

Assistant:

bool WebSocket::closed()
{
	if (_closed)
		return true;
	if (_socket.disconnected()) {
		_closed = true;
		_socket.close();
		return true;
	}
	return false;
}